

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O0

void __thiscall Profile::__displayBacktraceDynMap(Profile *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  shared_ptr<DynFuncCall> value;
  iterator it;
  ostream *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  DynFuncCall *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false> local_18
  ;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false>
  local_10 [2];
  
  if ((DebugFlag) && (bVar1 = isCurrentDebugType((char *)in_stack_ffffffffffffffc8), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"__displayBacktraceDynMap");
    poVar2 = std::operator<<(poVar2,":");
    this_00 = (void *)std::ostream::operator<<(poVar2,0x116);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_10[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
       ::begin((unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
                *)in_stack_ffffffffffffffa8);
  while( true ) {
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
         ::end((unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
                *)in_stack_ffffffffffffffa8);
    bVar1 = std::__detail::operator!=(local_10,&local_18);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false,_false>
                *)0x1dc399);
    std::shared_ptr<DynFuncCall>::shared_ptr
              ((shared_ptr<DynFuncCall> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               (shared_ptr<DynFuncCall> *)in_stack_ffffffffffffffa8);
    if (((DebugFlag & 1U) != 0) &&
       (in_stack_ffffffffffffffb7 = isCurrentDebugType((char *)in_stack_ffffffffffffffc8),
       (bool)in_stack_ffffffffffffffb7)) {
      std::__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<DynFuncCall,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      in_stack_ffffffffffffffa8 = ::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::ostream::operator<<(in_stack_ffffffffffffffa8,std::endl<char,std::char_traits<char>>);
    }
    std::shared_ptr<DynFuncCall>::~shared_ptr((shared_ptr<DynFuncCall> *)0x1dc42d);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_false,_false>
                *)in_stack_ffffffffffffffa8,0);
  }
  return;
}

Assistant:

void Profile::__displayBacktraceDynMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceDynamicMap.begin(); it != __backtraceDynamicMap.end(); it++){
        shared_ptr<DynFuncCall>value = it->second;
        DEBUG("info",cerr << *value << endl;);
    }
}